

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O0

void __thiscall fasttext::Loss::predict(Loss *this,Predictions *predictions,State *state)

{
  float *__args;
  int64_t iVar1;
  size_type in_RDX;
  Vector *in_RSI;
  long *in_RDI;
  int32_t i;
  Vector *output;
  int64_t in_stack_ffffffffffffffb8;
  Vector *this_00;
  undefined4 local_24;
  Vector *pVVar2;
  
  (**(code **)(*in_RDI + 0x18))(in_RDI,in_RDX);
  this_00 = in_RSI;
  Vector::size((Vector *)0x188ef5);
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::reserve
            ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)this_00,
             in_RDX);
  local_24 = 0;
  while( true ) {
    __args = (float *)(long)local_24;
    iVar1 = Vector::size((Vector *)0x188f1e);
    if (iVar1 <= (long)__args) break;
    pVVar2 = this_00;
    Vector::operator[](this_00,in_stack_ffffffffffffffb8);
    std_log(0.0);
    std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::emplace_back<float,int&>
              ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)in_RSI,
               __args,(int *)this_00);
    local_24 = local_24 + 1;
    this_00 = pVVar2;
  }
  return;
}

Assistant:

void Loss::predict(Predictions& predictions, Model::State& state) const {
  computeOutput(state);
  const Vector& output = state.output;
  predictions.reserve(output.size());
  for (int32_t i = 0; i < output.size(); i++) {
    predictions.emplace_back(std_log(output[i]), i);
  }
}